

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud.h
# Opt level: O3

int __thiscall
draco::PointCloud::GetAttributeIdByMetadataEntry(PointCloud *this,string *name,string *value)

{
  GeometryMetadata *this_00;
  int32_t iVar1;
  AttributeMetadata *pAVar2;
  
  this_00 = (this->metadata_)._M_t.
            super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
            .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  if (this_00 != (GeometryMetadata *)0x0) {
    pAVar2 = GeometryMetadata::GetAttributeMetadataByStringEntry(this_00,name,value);
    if (pAVar2 != (AttributeMetadata *)0x0) {
      iVar1 = GetAttributeIdByUniqueId(this,pAVar2->att_unique_id_);
      return iVar1;
    }
  }
  return -1;
}

Assistant:

int GetAttributeIdByMetadataEntry(const std::string &name,
                                    const std::string &value) const {
    if (metadata_ == nullptr) {
      return -1;
    }
    const AttributeMetadata *att_metadata =
        metadata_->GetAttributeMetadataByStringEntry(name, value);
    if (!att_metadata) {
      return -1;
    }
    return GetAttributeIdByUniqueId(att_metadata->att_unique_id());
  }